

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void google::protobuf::StripWhitespace(string *str)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  pointer pcVar6;
  long lVar7;
  char cVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *extraout_RDX;
  uint uVar11;
  char *pcVar12;
  char *pcVar13;
  string *in_R8;
  ulong uVar14;
  
  uVar14 = str->_M_string_length;
  uVar11 = (uint)uVar14;
  if ((int)uVar11 < 1) {
    uVar5 = 0;
  }
  else {
    uVar9 = (ulong)(uVar11 & 0x7fffffff);
    uVar5 = 0;
    do {
      uVar10 = uVar14;
      if (uVar14 == uVar5) goto LAB_00335e36;
      bVar1 = (str->_M_dataplus)._M_p[uVar5];
      if ((4 < bVar1 - 9) && (bVar1 != 0x20)) goto LAB_00335d82;
      uVar5 = uVar5 + 1;
    } while (uVar9 != uVar5);
    uVar5 = uVar14 & 0xffffffff;
  }
LAB_00335d82:
  uVar11 = uVar11 - (int)uVar5;
  if (uVar11 == 0) {
    str->_M_string_length = 0;
    pcVar6 = (str->_M_dataplus)._M_p;
  }
  else {
    if ((int)uVar5 != 0) {
      std::__cxx11::string::erase((ulong)str,0);
      uVar14 = (ulong)uVar11;
    }
    iVar3 = (int)uVar14;
    bVar2 = 0 < iVar3;
    uVar11 = iVar3 - 1U;
    if (0 < iVar3) {
      uVar9 = str->_M_string_length;
      do {
        iVar4 = (int)uVar14;
        uVar14 = (ulong)(iVar4 - 1U);
        uVar10 = uVar9;
        if (uVar9 <= uVar14) goto LAB_00335e36;
        bVar1 = (str->_M_dataplus)._M_p[uVar14];
        in_R8 = (string *)(ulong)bVar1;
        if ((4 < bVar1 - 9) && (uVar11 = iVar4 - 1U, bVar1 != 0x20)) goto LAB_00335df0;
        bVar2 = 0 < iVar4 + -1;
        uVar14 = (ulong)(iVar4 - 1U);
      } while (iVar4 - 1U != 0 && 0 < iVar4);
      uVar11 = 0xffffffff;
    }
LAB_00335df0:
    if ((bool)(~bVar2 & 1U | uVar11 == iVar3 - 1U)) {
      return;
    }
    uVar14 = (ulong)(uVar11 + 1);
    uVar9 = str->_M_string_length;
    if (uVar9 < uVar14) goto LAB_00335e3d;
    str->_M_string_length = uVar14;
    pcVar6 = (str->_M_dataplus)._M_p + uVar14;
  }
  *pcVar6 = '\0';
  return;
LAB_00335e36:
  uVar14 = std::__throw_out_of_range_fmt
                     ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
                      uVar10);
LAB_00335e3d:
  cVar8 = (char)uVar9;
  pcVar13 = "%s: __pos (which is %zu) > this->size() (which is %zu)";
  pcVar12 = "basic_string::erase";
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar14);
  if (*(ulong *)((long)pcVar12 + 8) == 0) {
    std::__cxx11::string::_M_append((char *)in_R8,*(ulong *)pcVar13);
    return;
  }
  uVar14 = 0;
  do {
    lVar7 = std::__cxx11::string::find(pcVar13,*(ulong *)pcVar12,uVar14);
    if (lVar7 == -1) break;
    std::__cxx11::string::append(in_R8,(ulong)pcVar13,uVar14);
    std::__cxx11::string::_M_append((char *)in_R8,*extraout_RDX);
    uVar14 = *(ulong *)((long)pcVar12 + 8) + lVar7;
  } while (cVar8 != '\0');
  std::__cxx11::string::append(in_R8,(ulong)pcVar13,uVar14);
  return;
}

Assistant:

void StripWhitespace(std::string *str) {
  int str_length = str->length();

  // Strip off leading whitespace.
  int first = 0;
  while (first < str_length && ascii_isspace(str->at(first))) {
    ++first;
  }
  // If entire string is white space.
  if (first == str_length) {
    str->clear();
    return;
  }
  if (first > 0) {
    str->erase(0, first);
    str_length -= first;
  }

  // Strip off trailing whitespace.
  int last = str_length - 1;
  while (last >= 0 && ascii_isspace(str->at(last))) {
    --last;
  }
  if (last != (str_length - 1) && last >= 0) {
    str->erase(last + 1, std::string::npos);
  }
}